

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_strip_final_slash(char *t)

{
  size_t sVar1;
  char *pcVar2;
  char *z;
  char *t_local;
  
  if (*t != '\0') {
    sVar1 = strlen(t);
    pcVar2 = t + (sVar1 - 1);
    if (((*pcVar2 == '\\') || (*pcVar2 == '/')) && ((pcVar2 != t + 2 || (t[1] != ':')))) {
      *pcVar2 = '\0';
    }
    if (*pcVar2 == '\\') {
      *pcVar2 = '/';
    }
  }
  return t;
}

Assistant:

char *stb_strip_final_slash(char *t)
{
   if (t[0]) {
      char *z = t + strlen(t) - 1;
      // *z is the last character
      if (*z == '\\' || *z == '/')
         if (z != t+2 || t[1] != ':') // but don't strip it if it's e.g. "c:/"
            *z = 0;
      if (*z == '\\')
         *z = '/'; // canonicalize to make sure it matches db
   }
   return t;
}